

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_fop_DFF(DisasContext_conflict8 *dc,int rd,int rs1,int rs2,
                _func_void_TCGContext_ptr_TCGv_i32_TCGv_ptr_TCGv_i32_TCGv_i32_conflict *gen)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 v;
  uintptr_t o_1;
  TCGv_i32 pTVar1;
  uintptr_t o_2;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = dc->uc->tcg_ctx;
  pTVar1 = gen_load_fpr_F(dc,rs1);
  local_38 = gen_load_fpr_F(dc,rs2);
  v = *(TCGv_i32 *)((long)dc->uc->tcg_ctx->cpu_fpr + (ulong)(rd & 0x1eU | (rd & 1U) << 5) * 4);
  local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_40 = pTVar1 + (long)tcg_ctx;
  local_38 = local_38 + (long)tcg_ctx;
  tcg_gen_callN_sparc64
            (tcg_ctx,helper_fsmuld_sparc64,(TCGTemp *)(v + (long)&tcg_ctx->pool_cur),3,&local_48);
  local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  tcg_gen_callN_sparc64
            (tcg_ctx,helper_check_ieee_exceptions_sparc64,
             (TCGTemp *)(tcg_ctx->cpu_fsr + (long)tcg_ctx),1,&local_48);
  gen_store_fpr_D(dc,rd,v);
  return;
}

Assistant:

static inline void gen_fop_DFF(DisasContext *dc, int rd, int rs1, int rs2,
                        void (*gen)(TCGContext *, TCGv_i64, TCGv_ptr, TCGv_i32, TCGv_i32))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i64 dst;
    TCGv_i32 src1, src2;

    src1 = gen_load_fpr_F(dc, rs1);
    src2 = gen_load_fpr_F(dc, rs2);
    dst = gen_dest_fpr_D(dc, rd);

    gen(tcg_ctx, dst, tcg_ctx->cpu_env, src1, src2);
    gen_helper_check_ieee_exceptions(tcg_ctx, tcg_ctx->cpu_fsr, tcg_ctx->cpu_env);

    gen_store_fpr_D(dc, rd, dst);
}